

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O0

void fetchTransformedBilinearARGB32PM_fast_rotate_helper<(TextureBlendType)4>
               (uint *b,uint *end,QTextureData *image,int *fx,int *fy,int fdx,int fdy)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  uint uVar17;
  uchar *puVar18;
  ulong uVar19;
  uint uVar20;
  int iVar21;
  int iVar22;
  uint uVar23;
  uint **ppuVar24;
  ulong uVar25;
  int iVar26;
  uint *in_RCX;
  int iVar27;
  QTextureData *in_RDX;
  ulong *in_RSI;
  ulong *in_RDI;
  uint *in_R8;
  int in_R9D;
  long in_FS_OFFSET;
  undefined1 auVar28 [16];
  short sVar29;
  short sVar37;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  short sVar35;
  short sVar36;
  short sVar38;
  short sVar43;
  short sVar44;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  short sVar45;
  ulong uVar39;
  ulong uVar40;
  ulong uVar41;
  ulong uVar42;
  int in_stack_00000008;
  int disty_2;
  int distx_2;
  uint br_2;
  uint bl_2;
  uint tr_2;
  uint tl_2;
  uint *s2_2;
  uint *s1_2;
  int disty_1;
  int distx_1;
  uint *s2_1;
  uint *s1_1;
  int y;
  int x;
  __m128i rRB;
  __m128i rAG;
  __m128i brRB;
  __m128i brAG;
  __m128i blRB;
  __m128i blAG;
  __m128i trRB;
  __m128i trAG;
  __m128i tlRB;
  __m128i tlAG;
  __m128i idxdy;
  __m128i dxidy;
  __m128i idxidy;
  __m128i disty_;
  __m128i distx_;
  __m128i dxdy;
  __m128i v_disty;
  __m128i v_distx;
  __m128i br_1;
  __m128i bl_1;
  uint *bottomData;
  __m128i tr_1;
  __m128i tl_1;
  uint *topData;
  int offset3;
  int offset2;
  int offset1;
  int offset0;
  __m128i offset;
  __m128i vy;
  __m128i vbpl;
  qsizetype bytesPerLine;
  uchar *textureData;
  __m128i v_fy;
  __m128i v_fx;
  __m128i v_fxy_r;
  __m128i v_fdy;
  __m128i v_fdx;
  __m128i v_256;
  __m128i colorMask;
  int disty;
  int distx;
  uint br;
  uint bl;
  uint tr;
  uint tl;
  uint *s2;
  uint *s1;
  qint64 max_fy;
  qint64 min_fy;
  qint64 max_fx;
  qint64 min_fx;
  int y2_1;
  int y1_1;
  int x2_1;
  int x1_1;
  uint *boundedEnd;
  int y2;
  int y1;
  int x2;
  int x1;
  uint in_stack_fffffffffffff3a8;
  undefined2 uVar46;
  uint in_stack_fffffffffffff3ac;
  ulong *in_stack_fffffffffffff3b0;
  ulong *in_stack_fffffffffffff3b8;
  undefined8 local_be8;
  undefined8 uStack_be0;
  undefined8 local_bd8;
  undefined8 uStack_bd0;
  undefined1 local_ae8 [16];
  undefined1 local_ad8 [16];
  undefined4 local_a58;
  short sStack_a54;
  undefined2 uStack_a52;
  short sStack_a50;
  undefined2 uStack_a4e;
  short sStack_a4c;
  undefined2 uStack_a4a;
  undefined8 local_a18;
  undefined8 uStack_a10;
  undefined8 local_a08;
  undefined8 uStack_a00;
  ulong *local_938;
  ushort local_8f8;
  ushort uStack_8f6;
  ushort uStack_8f4;
  ushort uStack_8f2;
  ushort uStack_8f0;
  ushort uStack_8ee;
  ushort uStack_8ec;
  ushort uStack_8ea;
  ushort local_8d8;
  ushort uStack_8d6;
  ushort uStack_8d4;
  ushort uStack_8d2;
  ushort uStack_8d0;
  ushort uStack_8ce;
  ushort uStack_8cc;
  ushort uStack_8ca;
  ushort local_8b8;
  ushort uStack_8b6;
  ushort uStack_8b4;
  ushort uStack_8b2;
  ushort uStack_8b0;
  ushort uStack_8ae;
  ushort uStack_8ac;
  ushort uStack_8aa;
  ushort local_898;
  ushort uStack_896;
  ushort uStack_894;
  ushort uStack_892;
  ushort uStack_890;
  ushort uStack_88e;
  ushort uStack_88c;
  ushort uStack_88a;
  ushort local_878;
  ushort uStack_876;
  ushort uStack_874;
  ushort uStack_872;
  ushort uStack_870;
  ushort uStack_86e;
  ushort uStack_86c;
  ushort uStack_86a;
  ushort local_858;
  ushort uStack_856;
  ushort uStack_854;
  ushort uStack_852;
  ushort uStack_850;
  ushort uStack_84e;
  ushort uStack_84c;
  ushort uStack_84a;
  ushort local_838;
  ushort uStack_836;
  ushort uStack_834;
  ushort uStack_832;
  ushort uStack_830;
  ushort uStack_82e;
  ushort uStack_82c;
  ushort uStack_82a;
  ushort local_818;
  ushort uStack_816;
  ushort uStack_814;
  ushort uStack_812;
  ushort uStack_810;
  ushort uStack_80e;
  ushort uStack_80c;
  ushort uStack_80a;
  short local_778;
  short sStack_776;
  short sStack_774;
  short sStack_772;
  short sStack_770;
  short sStack_76e;
  short sStack_76c;
  short sStack_76a;
  short local_738;
  short sStack_736;
  short sStack_734;
  short sStack_732;
  short sStack_730;
  short sStack_72e;
  short sStack_72c;
  short sStack_72a;
  short local_6f8;
  short sStack_6f6;
  short sStack_6f4;
  short sStack_6f2;
  short sStack_6f0;
  short sStack_6ee;
  short sStack_6ec;
  short sStack_6ea;
  short local_6b8;
  short sStack_6b6;
  short sStack_6b4;
  short sStack_6b2;
  short sStack_6b0;
  short sStack_6ae;
  short sStack_6ac;
  short sStack_6aa;
  short local_688;
  short sStack_686;
  short sStack_684;
  short sStack_682;
  short sStack_680;
  short sStack_67e;
  short sStack_67c;
  short sStack_67a;
  short local_678;
  short sStack_676;
  short sStack_674;
  short sStack_672;
  short sStack_670;
  short sStack_66e;
  short sStack_66c;
  short sStack_66a;
  short local_668;
  short sStack_666;
  short sStack_664;
  short sStack_662;
  short local_658;
  short sStack_656;
  short sStack_654;
  short sStack_652;
  short local_568;
  short sStack_566;
  short sStack_564;
  short sStack_562;
  short sStack_560;
  short sStack_55e;
  short sStack_55c;
  short sStack_55a;
  short local_558;
  short sStack_556;
  short sStack_554;
  short sStack_552;
  short sStack_550;
  short sStack_54e;
  short sStack_54c;
  short sStack_54a;
  undefined2 local_458;
  undefined2 uStack_456;
  undefined2 uStack_454;
  undefined2 uStack_452;
  uint local_428;
  uint uStack_424;
  uint uStack_420;
  uint uStack_41c;
  uint local_408;
  uint uStack_404;
  uint uStack_400;
  uint uStack_3fc;
  int iStack_1a4;
  int iStack_1a0;
  int iStack_19c;
  int iStack_184;
  int iStack_180;
  int iStack_17c;
  int iStack_164;
  int iStack_160;
  int iStack_15c;
  undefined4 uStack_b4;
  undefined4 uStack_ac;
  int local_50;
  int local_4c [3];
  uint *local_40;
  uint *local_38;
  uint *local_30;
  uint *local_28;
  ulong *local_20;
  int local_18;
  int local_14;
  int local_10;
  int local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  iVar21 = in_RDX->x1;
  iVar22 = in_RDX->x2;
  iVar26 = in_RDX->y1;
  iVar27 = in_RDX->y2;
  for (local_938 = in_RDI; local_938 < in_RSI; local_938 = (ulong *)((long)local_938 + 4)) {
    local_c = (int)*in_RCX >> 0x10;
    local_10 = -0x55555556;
    local_14 = (int)*in_R8 >> 0x10;
    local_18 = -0x55555556;
    fetchTransformedBilinear_pixelBounds<(TextureBlendType)4>
              (in_RDX->width,in_RDX->x1,in_RDX->x2 + -1,&local_c,&local_10);
    fetchTransformedBilinear_pixelBounds<(TextureBlendType)4>
              (in_RDX->height,in_RDX->y1,in_RDX->y2 + -1,&local_14,&local_18);
    if ((local_c != local_10) && (local_14 != local_18)) break;
    QTextureData::scanLine(in_RDX,local_14);
    QTextureData::scanLine(in_RDX,local_18);
    uVar20 = interpolate_4_pixels
                       ((uint)((ulong)in_stack_fffffffffffff3b8 >> 0x20),
                        (uint)in_stack_fffffffffffff3b8,
                        (uint)((ulong)in_stack_fffffffffffff3b0 >> 0x20),
                        (uint)in_stack_fffffffffffff3b0,in_stack_fffffffffffff3ac,
                        in_stack_fffffffffffff3a8);
    *(uint *)local_938 = uVar20;
    *in_RCX = in_R9D + *in_RCX;
    *in_R8 = in_stack_00000008 + *in_R8;
  }
  uVar46 = (undefined2)in_stack_fffffffffffff3ac;
  if (in_R9D < 1) {
    local_20 = in_RSI;
    if (in_R9D < 0) {
      local_30 = (uint *)((long)local_938 +
                         (((long)iVar21 * 0x10000 - (long)(int)*in_RCX) / (long)in_R9D) * 4);
      ppuVar24 = qMin<unsigned_int*>((uint **)&local_20,&local_30);
      local_20 = (ulong *)*ppuVar24;
    }
  }
  else {
    local_28 = (uint *)((long)local_938 +
                       (((long)(iVar22 + -1) * 0x10000 - (long)(int)*in_RCX) / (long)in_R9D) * 4);
    ppuVar24 = qMin<unsigned_int*>((uint **)&local_20,&local_28);
    local_20 = (ulong *)*ppuVar24;
  }
  if (in_stack_00000008 < 1) {
    if (in_stack_00000008 < 0) {
      local_40 = (uint *)((long)local_938 +
                         (((long)iVar26 * 0x10000 - (long)(int)*in_R8) / (long)in_stack_00000008) *
                         4);
      in_stack_fffffffffffff3b0 = local_938;
      ppuVar24 = qMin<unsigned_int*>((uint **)&local_20,&local_40);
      local_20 = (ulong *)*ppuVar24;
    }
  }
  else {
    local_38 = (uint *)((long)local_938 +
                       (((long)(iVar27 + -1) * 0x10000 - (long)(int)*in_R8) /
                       (long)in_stack_00000008) * 4);
    in_stack_fffffffffffff3b8 = local_938;
    ppuVar24 = qMin<unsigned_int*>((uint **)&local_20,&local_38);
    local_20 = (ulong *)*ppuVar24;
  }
  uVar20 = CONCAT22(0x100,uVar46);
  iVar21 = in_R9D * 4;
  iVar22 = in_stack_00000008 * 4;
  iVar27 = *in_RCX + in_R9D;
  iVar26 = iVar27 + in_R9D;
  local_a08 = CONCAT44(iVar27,*in_RCX);
  uStack_a00 = CONCAT44(iVar26 + in_R9D,iVar26);
  iVar27 = *in_R8 + in_stack_00000008;
  iVar26 = iVar27 + in_stack_00000008;
  local_a18 = CONCAT44(iVar27,*in_R8);
  uStack_a10 = CONCAT44(iVar26 + in_stack_00000008,iVar26);
  puVar18 = in_RDX->imageData;
  uVar19 = in_RDX->bytesPerLine;
  uVar25 = uVar19;
  if ((long)uVar19 < 0) {
    uVar25 = uVar19 + 3;
  }
  auVar28 = ZEXT416((uint)(uVar25 >> 2));
  auVar28 = pshuflw(auVar28,auVar28,0);
  while( true ) {
    local_408 = (uint)local_a18;
    local_428 = (uint)local_a08;
    if ((ulong *)((long)local_20 + -0xc) <= local_938) break;
    uStack_404 = (uint)((ulong)local_a18 >> 0x20);
    uStack_400 = (uint)uStack_a10;
    uStack_3fc = (uint)((ulong)uStack_a10 >> 0x20);
    auVar33._4_4_ = uStack_404 >> 0x10;
    auVar33._0_4_ = local_408 >> 0x10;
    auVar33._8_4_ = uStack_400 >> 0x10;
    auVar33._12_4_ = uStack_3fc >> 0x10;
    auVar33 = packssdw(auVar33,ZEXT816(0));
    local_658 = auVar33._0_2_;
    sStack_656 = auVar33._2_2_;
    sStack_654 = auVar33._4_2_;
    sStack_652 = auVar33._6_2_;
    local_668 = auVar28._0_2_;
    sStack_666 = auVar28._2_2_;
    sStack_664 = auVar28._4_2_;
    sStack_662 = auVar28._6_2_;
    auVar33 = pmulhw(auVar33,auVar28);
    local_458 = auVar33._0_2_;
    uStack_456 = auVar33._2_2_;
    uStack_454 = auVar33._4_2_;
    uStack_452 = auVar33._6_2_;
    local_a58 = CONCAT22(local_458,local_658 * local_668);
    _local_a58 = CONCAT24(sStack_656 * sStack_666,local_a58);
    _local_a58 = CONCAT26(uStack_456,_local_a58);
    sStack_a50 = sStack_654 * sStack_664;
    uStack_a4e = uStack_454;
    sStack_a4c = sStack_652 * sStack_662;
    uStack_a4a = uStack_452;
    uStack_424 = (uint)((ulong)local_a08 >> 0x20);
    uStack_420 = (uint)uStack_a00;
    uStack_41c = (uint)((ulong)uStack_a00 >> 0x20);
    iStack_164 = (int)((ulong)_local_a58 >> 0x20);
    iStack_160 = local_a58._8_4_;
    iStack_15c = local_a58._12_4_;
    local_a58 = local_a58 + (local_428 >> 0x10);
    iStack_164 = iStack_164 + (uStack_424 >> 0x10);
    iStack_160 = iStack_160 + (uStack_420 >> 0x10);
    iStack_15c = iStack_15c + (uStack_41c >> 0x10);
    uVar1 = *(undefined4 *)(puVar18 + (long)local_a58 * 4);
    uVar2 = *(undefined4 *)(puVar18 + (long)iStack_164 * 4);
    uVar3 = *(undefined4 *)(puVar18 + (long)iStack_160 * 4);
    uVar4 = *(undefined4 *)(puVar18 + (long)iStack_15c * 4);
    uVar5 = *(undefined4 *)(puVar18 + (long)local_a58 * 4 + 4);
    uVar6 = *(undefined4 *)(puVar18 + (long)iStack_164 * 4 + 4);
    uVar7 = *(undefined4 *)(puVar18 + (long)iStack_160 * 4 + 4);
    uVar8 = *(undefined4 *)(puVar18 + (long)iStack_15c * 4 + 4);
    uVar9 = *(undefined4 *)(puVar18 + (long)local_a58 * 4 + uVar19);
    uVar10 = *(undefined4 *)(puVar18 + (long)iStack_164 * 4 + uVar19);
    uVar11 = *(undefined4 *)(puVar18 + (long)iStack_160 * 4 + uVar19);
    uVar12 = *(undefined4 *)(puVar18 + (long)iStack_15c * 4 + uVar19);
    uVar13 = *(undefined4 *)(puVar18 + (long)local_a58 * 4 + uVar19 + 4);
    uVar14 = *(undefined4 *)(puVar18 + (long)iStack_164 * 4 + uVar19 + 4);
    uVar15 = *(undefined4 *)(puVar18 + (long)iStack_160 * 4 + uVar19 + 4);
    uVar16 = *(undefined4 *)(puVar18 + (long)iStack_15c * 4 + uVar19 + 4);
    local_818 = (ushort)local_a08;
    uStack_816 = (ushort)((ulong)local_a08 >> 0x10);
    uStack_814 = (ushort)((ulong)local_a08 >> 0x20);
    uStack_810 = (ushort)uStack_a00;
    uStack_80e = (ushort)((ulong)uStack_a00 >> 0x10);
    uStack_80c = (ushort)((ulong)uStack_a00 >> 0x20);
    local_ad8._2_2_ = uStack_816 >> 8;
    local_ad8._0_2_ = local_818 >> 8;
    local_ad8._4_2_ = uStack_814 >> 8;
    local_ad8._6_2_ = (ushort)((ulong)local_a08 >> 0x38);
    local_ad8._8_2_ = uStack_810 >> 8;
    local_ad8._10_2_ = uStack_80e >> 8;
    local_ad8._12_2_ = uStack_80c >> 8;
    local_ad8._14_2_ = (ushort)((ulong)uStack_a00 >> 0x38);
    local_838 = (ushort)local_a18;
    uStack_836 = (ushort)((ulong)local_a18 >> 0x10);
    uStack_834 = (ushort)((ulong)local_a18 >> 0x20);
    uStack_830 = (ushort)uStack_a10;
    uStack_82e = (ushort)((ulong)uStack_a10 >> 0x10);
    uStack_82c = (ushort)((ulong)uStack_a10 >> 0x20);
    local_ae8._2_2_ = uStack_836 >> 8;
    local_ae8._0_2_ = local_838 >> 8;
    local_ae8._4_2_ = uStack_834 >> 8;
    local_ae8._6_2_ = (ushort)((ulong)local_a18 >> 0x38);
    local_ae8._8_2_ = uStack_830 >> 8;
    local_ae8._10_2_ = uStack_82e >> 8;
    local_ae8._12_2_ = uStack_82c >> 8;
    local_ae8._14_2_ = (ushort)((ulong)uStack_a10 >> 0x38);
    iStack_184 = SUB84(local_ad8._0_8_,4);
    iStack_180 = local_ad8._8_4_;
    iStack_17c = local_ad8._12_4_;
    local_858 = (ushort)(local_ad8._0_4_ + 8);
    uStack_854 = (ushort)(iStack_184 + 8);
    uStack_850 = (ushort)(iStack_180 + 8);
    uStack_84c = (ushort)(iStack_17c + 8);
    local_ad8._2_2_ = (ushort)((uint)(local_ad8._0_4_ + 8) >> 0x14);
    local_ad8._0_2_ = local_858 >> 4;
    local_ad8._4_2_ = uStack_854 >> 4;
    local_ad8._6_2_ = (ushort)((uint)(iStack_184 + 8) >> 0x14);
    local_ad8._8_2_ = uStack_850 >> 4;
    local_ad8._10_2_ = (ushort)((uint)(iStack_180 + 8) >> 0x14);
    local_ad8._12_2_ = uStack_84c >> 4;
    local_ad8._14_2_ = (ushort)((uint)(iStack_17c + 8) >> 0x14);
    iStack_1a4 = SUB84(local_ae8._0_8_,4);
    iStack_1a0 = local_ae8._8_4_;
    iStack_19c = local_ae8._12_4_;
    local_878 = (ushort)(local_ae8._0_4_ + 8);
    uStack_874 = (ushort)(iStack_1a4 + 8);
    uStack_870 = (ushort)(iStack_1a0 + 8);
    uStack_86c = (ushort)(iStack_19c + 8);
    local_ae8._2_2_ = (ushort)((uint)(local_ae8._0_4_ + 8) >> 0x14);
    local_ae8._0_2_ = local_878 >> 4;
    local_ae8._4_2_ = uStack_874 >> 4;
    local_ae8._6_2_ = (ushort)((uint)(iStack_1a4 + 8) >> 0x14);
    local_ae8._8_2_ = uStack_870 >> 4;
    local_ae8._10_2_ = (ushort)((uint)(iStack_1a0 + 8) >> 0x14);
    local_ae8._12_2_ = uStack_86c >> 4;
    local_ae8._14_2_ = (ushort)((uint)(iStack_19c + 8) >> 0x14);
    auVar33 = pshufhw(local_ad8,local_ad8,0xa0);
    auVar33 = pshuflw(auVar33,auVar33,0xa0);
    auVar34 = pshufhw(local_ae8,local_ae8,0xa0);
    auVar34 = pshuflw(auVar34,auVar34,0xa0);
    local_678 = auVar33._0_2_;
    sStack_676 = auVar33._2_2_;
    sStack_674 = auVar33._4_2_;
    sStack_672 = auVar33._6_2_;
    sStack_670 = auVar33._8_2_;
    sStack_66e = auVar33._10_2_;
    sStack_66c = auVar33._12_2_;
    sStack_66a = auVar33._14_2_;
    local_688 = auVar34._0_2_;
    sStack_686 = auVar34._2_2_;
    sStack_684 = auVar34._4_2_;
    sStack_682 = auVar34._6_2_;
    sStack_680 = auVar34._8_2_;
    sStack_67e = auVar34._10_2_;
    sStack_67c = auVar34._12_2_;
    sStack_67a = auVar34._14_2_;
    local_678 = local_678 * local_688;
    sStack_676 = sStack_676 * sStack_686;
    sStack_674 = sStack_674 * sStack_684;
    sStack_672 = sStack_672 * sStack_682;
    sStack_670 = sStack_670 * sStack_680;
    sStack_66e = sStack_66e * sStack_67e;
    sStack_66c = sStack_66c * sStack_67c;
    sStack_66a = sStack_66a * sStack_67a;
    auVar33 = psllw(auVar33,ZEXT416(4));
    auVar34 = psllw(auVar34,ZEXT416(4));
    local_558 = auVar33._0_2_;
    sStack_556 = auVar33._2_2_;
    sStack_554 = auVar33._4_2_;
    sStack_552 = auVar33._6_2_;
    sStack_550 = auVar33._8_2_;
    sStack_54e = auVar33._10_2_;
    sStack_54c = auVar33._12_2_;
    sStack_54a = auVar33._14_2_;
    local_568 = auVar34._0_2_;
    sStack_566 = auVar34._2_2_;
    sStack_564 = auVar34._4_2_;
    sStack_562 = auVar34._6_2_;
    sStack_560 = auVar34._8_2_;
    sStack_55e = auVar34._10_2_;
    sStack_55c = auVar34._12_2_;
    sStack_55a = auVar34._14_2_;
    sVar29 = local_678 + (0x100 - (local_558 + local_568));
    sVar35 = sStack_676 + (0x100 - (sStack_556 + sStack_566));
    sVar36 = sStack_674 + (0x100 - (sStack_554 + sStack_564));
    sVar37 = sStack_672 + (0x100 - (sStack_552 + sStack_562));
    sVar38 = sStack_670 + (0x100 - (sStack_550 + sStack_560));
    sVar43 = sStack_66e + (0x100 - (sStack_54e + sStack_55e));
    sVar44 = sStack_66c + (0x100 - (sStack_54c + sStack_55c));
    sVar45 = sStack_66a + (0x100 - (sStack_54a + sStack_55a));
    local_898 = (ushort)uVar1;
    uStack_894 = (ushort)uVar2;
    uStack_890 = (ushort)uVar3;
    uStack_88c = (ushort)uVar4;
    uVar25 = CONCAT44(uVar2,uVar1) & 0xff00ff00ff00ff;
    uVar39 = CONCAT44(uVar4,uVar3) & 0xff00ff00ff00ff;
    local_8b8 = (ushort)uVar5;
    uStack_8b4 = (ushort)uVar6;
    uStack_8b0 = (ushort)uVar7;
    uStack_8ac = (ushort)uVar8;
    uVar30 = CONCAT44(uVar6,uVar5) & 0xff00ff00ff00ff;
    uVar40 = CONCAT44(uVar8,uVar7) & 0xff00ff00ff00ff;
    local_8d8 = (ushort)uVar9;
    uStack_8d4 = (ushort)uVar10;
    uStack_8d0 = (ushort)uVar11;
    uStack_8cc = (ushort)uVar12;
    uVar31 = CONCAT44(uVar10,uVar9) & 0xff00ff00ff00ff;
    uVar41 = CONCAT44(uVar12,uVar11) & 0xff00ff00ff00ff;
    local_8f8 = (ushort)uVar13;
    uStack_8f4 = (ushort)uVar14;
    uStack_8f0 = (ushort)uVar15;
    uStack_8ec = (ushort)uVar16;
    uVar32 = CONCAT44(uVar14,uVar13) & 0xff00ff00ff00ff;
    uVar42 = CONCAT44(uVar16,uVar15) & 0xff00ff00ff00ff;
    local_6b8 = (short)uVar25;
    sStack_6b6 = (short)(uVar25 >> 0x10);
    sStack_6b4 = (short)(uVar25 >> 0x20);
    sStack_6b2 = (short)(uVar25 >> 0x30);
    sStack_6b0 = (short)uVar39;
    sStack_6ae = (short)(uVar39 >> 0x10);
    sStack_6ac = (short)(uVar39 >> 0x20);
    sStack_6aa = (short)(uVar39 >> 0x30);
    local_6f8 = (short)uVar30;
    sStack_6f6 = (short)(uVar30 >> 0x10);
    sStack_6f4 = (short)(uVar30 >> 0x20);
    sStack_6f2 = (short)(uVar30 >> 0x30);
    sStack_6f0 = (short)uVar40;
    sStack_6ee = (short)(uVar40 >> 0x10);
    sStack_6ec = (short)(uVar40 >> 0x20);
    sStack_6ea = (short)(uVar40 >> 0x30);
    local_738 = (short)uVar31;
    sStack_736 = (short)(uVar31 >> 0x10);
    sStack_734 = (short)(uVar31 >> 0x20);
    sStack_732 = (short)(uVar31 >> 0x30);
    sStack_730 = (short)uVar41;
    sStack_72e = (short)(uVar41 >> 0x10);
    sStack_72c = (short)(uVar41 >> 0x20);
    sStack_72a = (short)(uVar41 >> 0x30);
    local_778 = (short)uVar32;
    sStack_776 = (short)(uVar32 >> 0x10);
    sStack_774 = (short)(uVar32 >> 0x20);
    sStack_772 = (short)(uVar32 >> 0x30);
    sStack_770 = (short)uVar42;
    sStack_76e = (short)(uVar42 >> 0x10);
    sStack_76c = (short)(uVar42 >> 0x20);
    sStack_76a = (short)(uVar42 >> 0x30);
    local_bd8._0_4_ =
         CONCAT22((ushort)((uint)uVar1 >> 0x18) * sVar35 +
                  (ushort)((uint)uVar5 >> 0x18) * (sStack_556 - sStack_676) +
                  (ushort)((uint)uVar9 >> 0x18) * (sStack_566 - sStack_676) +
                  (ushort)((uint)uVar13 >> 0x18) * sStack_676,
                  (local_898 >> 8) * sVar29 + (local_8b8 >> 8) * (local_558 - local_678) +
                  (local_8d8 >> 8) * (local_568 - local_678) + (local_8f8 >> 8) * local_678);
    local_bd8 = CONCAT26((ushort)((uint)uVar2 >> 0x18) * sVar37 +
                         (ushort)((uint)uVar6 >> 0x18) * (sStack_552 - sStack_672) +
                         (ushort)((uint)uVar10 >> 0x18) * (sStack_562 - sStack_672) +
                         (ushort)((uint)uVar14 >> 0x18) * sStack_672,
                         CONCAT24((uStack_894 >> 8) * sVar36 +
                                  (uStack_8b4 >> 8) * (sStack_554 - sStack_674) +
                                  (uStack_8d4 >> 8) * (sStack_564 - sStack_674) +
                                  (uStack_8f4 >> 8) * sStack_674,(undefined4)local_bd8));
    uStack_bd0._0_4_ =
         CONCAT22((ushort)((uint)uVar3 >> 0x18) * sVar43 +
                  (ushort)((uint)uVar7 >> 0x18) * (sStack_54e - sStack_66e) +
                  (ushort)((uint)uVar11 >> 0x18) * (sStack_55e - sStack_66e) +
                  (ushort)((uint)uVar15 >> 0x18) * sStack_66e,
                  (uStack_890 >> 8) * sVar38 + (uStack_8b0 >> 8) * (sStack_550 - sStack_670) +
                  (uStack_8d0 >> 8) * (sStack_560 - sStack_670) + (uStack_8f0 >> 8) * sStack_670);
    uStack_bd0 = CONCAT26((ushort)((uint)uVar4 >> 0x18) * sVar45 +
                          (ushort)((uint)uVar8 >> 0x18) * (sStack_54a - sStack_66a) +
                          (ushort)((uint)uVar12 >> 0x18) * (sStack_55a - sStack_66a) +
                          (ushort)((uint)uVar16 >> 0x18) * sStack_66a,
                          CONCAT24((uStack_88c >> 8) * sVar44 +
                                   (uStack_8ac >> 8) * (sStack_54c - sStack_66c) +
                                   (uStack_8cc >> 8) * (sStack_55c - sStack_66c) +
                                   (uStack_8ec >> 8) * sStack_66c,(undefined4)uStack_bd0));
    uStack_b4 = (undefined4)(local_bd8 >> 0x20);
    uStack_ac = (undefined4)(uStack_bd0 >> 0x20);
    local_bd8 = CONCAT44(uStack_b4,(undefined4)local_bd8) & 0xff00ff00ff00ff00;
    uStack_bd0 = CONCAT44(uStack_ac,(undefined4)uStack_bd0) & 0xff00ff00ff00ff00;
    local_be8 = CONCAT26((ushort)(sStack_6b2 * sVar37 + sStack_6f2 * (sStack_552 - sStack_672) +
                                 sStack_732 * (sStack_562 - sStack_672) + sStack_772 * sStack_672)
                         >> 8,CONCAT24((ushort)(sStack_6b4 * sVar36 +
                                                sStack_6f4 * (sStack_554 - sStack_674) +
                                               sStack_734 * (sStack_564 - sStack_674) +
                                               sStack_774 * sStack_674) >> 8,
                                       CONCAT22((ushort)(sStack_6b6 * sVar35 +
                                                         sStack_6f6 * (sStack_556 - sStack_676) +
                                                        sStack_736 * (sStack_566 - sStack_676) +
                                                        sStack_776 * sStack_676) >> 8,
                                                (ushort)(local_6b8 * sVar29 +
                                                         local_6f8 * (local_558 - local_678) +
                                                        local_738 * (local_568 - local_678) +
                                                        local_778 * local_678) >> 8)));
    uStack_be0 = CONCAT26((ushort)(sStack_6aa * sVar45 + sStack_6ea * (sStack_54a - sStack_66a) +
                                  sStack_72a * (sStack_55a - sStack_66a) + sStack_76a * sStack_66a)
                          >> 8,CONCAT24((ushort)(sStack_6ac * sVar44 +
                                                 sStack_6ec * (sStack_54c - sStack_66c) +
                                                sStack_72c * (sStack_55c - sStack_66c) +
                                                sStack_76c * sStack_66c) >> 8,
                                        CONCAT22((ushort)(sStack_6ae * sVar43 +
                                                          sStack_6ee * (sStack_54e - sStack_66e) +
                                                         sStack_72e * (sStack_55e - sStack_66e) +
                                                         sStack_76e * sStack_66e) >> 8,
                                                 (ushort)(sStack_6b0 * sVar38 +
                                                          sStack_6f0 * (sStack_550 - sStack_670) +
                                                         sStack_730 * (sStack_560 - sStack_670) +
                                                         sStack_770 * sStack_670) >> 8)));
    *local_938 = local_bd8 | local_be8;
    local_938[1] = uStack_bd0 | uStack_be0;
    local_938 = local_938 + 2;
    local_a08 = CONCAT44(uStack_424 + iVar21,local_428 + iVar21);
    uStack_a00 = CONCAT44(uStack_41c + iVar21,uStack_420 + iVar21);
    local_a18 = CONCAT44(uStack_404 + iVar22,local_408 + iVar22);
    uStack_a10 = CONCAT44(uStack_3fc + iVar22,uStack_400 + iVar22);
  }
  *in_RCX = local_428;
  *in_R8 = local_408;
  for (; local_938 < local_20; local_938 = (ulong *)((long)local_938 + 4)) {
    uVar17 = *in_R8;
    QTextureData::scanLine(in_RDX,(int)uVar17 >> 0x10);
    QTextureData::scanLine(in_RDX,((int)uVar17 >> 0x10) + 1);
    uVar23 = interpolate_4_pixels
                       ((uint *)in_stack_fffffffffffff3b8,(uint *)in_stack_fffffffffffff3b0,uVar20,
                        in_stack_fffffffffffff3a8);
    *(uint *)local_938 = uVar23;
    *in_RCX = in_R9D + *in_RCX;
    *in_R8 = in_stack_00000008 + *in_R8;
  }
  for (; local_938 < in_RSI; local_938 = (ulong *)((long)local_938 + 4)) {
    local_4c[2] = (int)*in_RCX >> 0x10;
    local_4c[1] = 0xaaaaaaaa;
    local_4c[0] = (int)*in_R8 >> 0x10;
    local_50 = -0x55555556;
    fetchTransformedBilinear_pixelBounds<(TextureBlendType)4>
              (in_RDX->width,in_RDX->x1,in_RDX->x2 + -1,local_4c + 2,local_4c + 1);
    fetchTransformedBilinear_pixelBounds<(TextureBlendType)4>
              (in_RDX->height,in_RDX->y1,in_RDX->y2 + -1,local_4c,&local_50);
    QTextureData::scanLine(in_RDX,local_4c[0]);
    QTextureData::scanLine(in_RDX,local_50);
    uVar23 = interpolate_4_pixels
                       ((uint)((ulong)in_stack_fffffffffffff3b8 >> 0x20),
                        (uint)in_stack_fffffffffffff3b8,
                        (uint)((ulong)in_stack_fffffffffffff3b0 >> 0x20),
                        (uint)in_stack_fffffffffffff3b0,uVar20,in_stack_fffffffffffff3a8);
    *(uint *)local_938 = uVar23;
    *in_RCX = in_R9D + *in_RCX;
    *in_R8 = in_stack_00000008 + *in_R8;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void QT_FASTCALL fetchTransformedBilinearARGB32PM_fast_rotate_helper(uint *b, uint *end, const QTextureData &image,
                                                                            int &fx, int &fy, int fdx, int fdy)
{
    //we are zooming less than 8x, use 4bit precision
    if (blendType != BlendTransformedBilinearTiled) {
        const qint64 min_fx = qint64(image.x1) * fixed_scale;
        const qint64 max_fx = qint64(image.x2 - 1) * fixed_scale;
        const qint64 min_fy = qint64(image.y1) * fixed_scale;
        const qint64 max_fy = qint64(image.y2 - 1) * fixed_scale;
        // first handle the possibly bounded part in the beginning
        while (b < end) {
            int x1 = (fx >> 16);
            int x2;
            int y1 = (fy >> 16);
            int y2;
            fetchTransformedBilinear_pixelBounds<blendType>(image.width, image.x1, image.x2 - 1, x1, x2);
            fetchTransformedBilinear_pixelBounds<blendType>(image.height, image.y1, image.y2 - 1, y1, y2);
            if (x1 != x2 && y1 != y2)
                break;
            const uint *s1 = (const uint *)image.scanLine(y1);
            const uint *s2 = (const uint *)image.scanLine(y2);
            uint tl = s1[x1];
            uint tr = s1[x2];
            uint bl = s2[x1];
            uint br = s2[x2];
            if (hasFastInterpolate4()) {
                int distx = (fx & 0x0000ffff) >> 8;
                int disty = (fy & 0x0000ffff) >> 8;
                *b = interpolate_4_pixels(tl, tr, bl, br, distx, disty);
            } else {
                int distx = ((fx & 0x0000ffff) + 0x0800) >> 12;
                int disty = ((fy & 0x0000ffff) + 0x0800) >> 12;
                *b = interpolate_4_pixels_16(tl, tr, bl, br, distx, disty);
            }
            fx += fdx;
            fy += fdy;
            ++b;
        }
        uint *boundedEnd = end;
        if (fdx > 0)
            boundedEnd = qMin(boundedEnd, b + (max_fx - fx) / fdx);
        else if (fdx < 0)
            boundedEnd = qMin(boundedEnd, b + (min_fx - fx) / fdx);
        if (fdy > 0)
            boundedEnd = qMin(boundedEnd, b + (max_fy - fy) / fdy);
        else if (fdy < 0)
            boundedEnd = qMin(boundedEnd, b + (min_fy - fy) / fdy);

        // until boundedEnd we can now have a fast middle part without boundary checks
#if defined(__SSE2__)
        const __m128i colorMask = _mm_set1_epi32(0x00ff00ff);
        const __m128i v_256 = _mm_set1_epi16(256);
        const __m128i v_fdx = _mm_set1_epi32(fdx*4);
        const __m128i v_fdy = _mm_set1_epi32(fdy*4);
        const __m128i v_fxy_r = _mm_set1_epi32(0x8);
        __m128i v_fx = _mm_setr_epi32(fx, fx + fdx, fx + fdx + fdx, fx + fdx + fdx + fdx);
        __m128i v_fy = _mm_setr_epi32(fy, fy + fdy, fy + fdy + fdy, fy + fdy + fdy + fdy);

        const uchar *textureData = image.imageData;
        const qsizetype bytesPerLine = image.bytesPerLine;
        const __m128i vbpl = _mm_shufflelo_epi16(_mm_cvtsi32_si128(bytesPerLine/4), _MM_SHUFFLE(0, 0, 0, 0));

        while (b < boundedEnd - 3) {
            const __m128i vy = _mm_packs_epi32(_mm_srli_epi32(v_fy, 16), _mm_setzero_si128());
            // 4x16bit * 4x16bit -> 4x32bit
            __m128i offset = _mm_unpacklo_epi16(_mm_mullo_epi16(vy, vbpl), _mm_mulhi_epi16(vy, vbpl));
            offset = _mm_add_epi32(offset, _mm_srli_epi32(v_fx, 16));
            const int offset0 = _mm_cvtsi128_si32(offset); offset = _mm_srli_si128(offset, 4);
            const int offset1 = _mm_cvtsi128_si32(offset); offset = _mm_srli_si128(offset, 4);
            const int offset2 = _mm_cvtsi128_si32(offset); offset = _mm_srli_si128(offset, 4);
            const int offset3 = _mm_cvtsi128_si32(offset);
            const uint *topData = (const uint *)(textureData);
            const __m128i tl = _mm_setr_epi32(topData[offset0], topData[offset1], topData[offset2], topData[offset3]);
            const __m128i tr = _mm_setr_epi32(topData[offset0 + 1], topData[offset1 + 1], topData[offset2 + 1], topData[offset3 + 1]);
            const uint *bottomData = (const uint *)(textureData + bytesPerLine);
            const __m128i bl = _mm_setr_epi32(bottomData[offset0], bottomData[offset1], bottomData[offset2], bottomData[offset3]);
            const __m128i br = _mm_setr_epi32(bottomData[offset0 + 1], bottomData[offset1 + 1], bottomData[offset2 + 1], bottomData[offset3 + 1]);

            __m128i v_distx = _mm_srli_epi16(v_fx, 8);
            __m128i v_disty = _mm_srli_epi16(v_fy, 8);
            v_distx = _mm_srli_epi16(_mm_add_epi32(v_distx, v_fxy_r), 4);
            v_disty = _mm_srli_epi16(_mm_add_epi32(v_disty, v_fxy_r), 4);
            v_distx = _mm_shufflehi_epi16(v_distx, _MM_SHUFFLE(2,2,0,0));
            v_distx = _mm_shufflelo_epi16(v_distx, _MM_SHUFFLE(2,2,0,0));
            v_disty = _mm_shufflehi_epi16(v_disty, _MM_SHUFFLE(2,2,0,0));
            v_disty = _mm_shufflelo_epi16(v_disty, _MM_SHUFFLE(2,2,0,0));

            interpolate_4_pixels_16_sse2(tl, tr, bl, br, v_distx, v_disty, colorMask, v_256, b);
            b += 4;
            v_fx = _mm_add_epi32(v_fx, v_fdx);
            v_fy = _mm_add_epi32(v_fy, v_fdy);
        }
        fx = _mm_cvtsi128_si32(v_fx);
        fy = _mm_cvtsi128_si32(v_fy);
#elif defined(__ARM_NEON__)
        const int16x8_t colorMask = vdupq_n_s16(0x00ff);
        const int16x8_t invColorMask = vmvnq_s16(colorMask);
        const int16x8_t v_256 = vdupq_n_s16(256);
        int32x4_t v_fdx = vdupq_n_s32(fdx * 4);
        int32x4_t v_fdy = vdupq_n_s32(fdy * 4);

        const uchar *textureData = image.imageData;
        const qsizetype bytesPerLine = image.bytesPerLine;

        int32x4_t v_fx = vmovq_n_s32(fx);
        int32x4_t v_fy = vmovq_n_s32(fy);
        v_fx = vsetq_lane_s32(fx + fdx, v_fx, 1);
        v_fy = vsetq_lane_s32(fy + fdy, v_fy, 1);
        v_fx = vsetq_lane_s32(fx + fdx * 2, v_fx, 2);
        v_fy = vsetq_lane_s32(fy + fdy * 2, v_fy, 2);
        v_fx = vsetq_lane_s32(fx + fdx * 3, v_fx, 3);
        v_fy = vsetq_lane_s32(fy + fdy * 3, v_fy, 3);

        const int32x4_t v_ffff_mask = vdupq_n_s32(0x0000ffff);
        const int32x4_t v_round = vdupq_n_s32(0x0800);

         // Pre-initialize to work-around code-analysis warnings/crashes in MSVC:
        uint32x4x2_t v_top = {};
        uint32x4x2_t v_bot = {};
        while (b < boundedEnd - 3) {
            int x1 = (fx >> 16);
            int y1 = (fy >> 16);
            fx += fdx; fy += fdy;
            const uchar *sl = textureData + bytesPerLine * y1;
            const uint *s1 = reinterpret_cast<const uint *>(sl);
            const uint *s2 = reinterpret_cast<const uint *>(sl + bytesPerLine);
            v_top = vld2q_lane_u32(s1 + x1, v_top, 0);
            v_bot = vld2q_lane_u32(s2 + x1, v_bot, 0);
            x1 = (fx >> 16);
            y1 = (fy >> 16);
            fx += fdx; fy += fdy;
            sl = textureData + bytesPerLine * y1;
            s1 = reinterpret_cast<const uint *>(sl);
            s2 = reinterpret_cast<const uint *>(sl + bytesPerLine);
            v_top = vld2q_lane_u32(s1 + x1, v_top, 1);
            v_bot = vld2q_lane_u32(s2 + x1, v_bot, 1);
            x1 = (fx >> 16);
            y1 = (fy >> 16);
            fx += fdx; fy += fdy;
            sl = textureData + bytesPerLine * y1;
            s1 = reinterpret_cast<const uint *>(sl);
            s2 = reinterpret_cast<const uint *>(sl + bytesPerLine);
            v_top = vld2q_lane_u32(s1 + x1, v_top, 2);
            v_bot = vld2q_lane_u32(s2 + x1, v_bot, 2);
            x1 = (fx >> 16);
            y1 = (fy >> 16);
            fx += fdx; fy += fdy;
            sl = textureData + bytesPerLine * y1;
            s1 = reinterpret_cast<const uint *>(sl);
            s2 = reinterpret_cast<const uint *>(sl + bytesPerLine);
            v_top = vld2q_lane_u32(s1 + x1, v_top, 3);
            v_bot = vld2q_lane_u32(s2 + x1, v_bot, 3);

            int32x4_t v_distx = vshrq_n_s32(vaddq_s32(vandq_s32(v_fx, v_ffff_mask), v_round), 12);
            int32x4_t v_disty = vshrq_n_s32(vaddq_s32(vandq_s32(v_fy, v_ffff_mask), v_round), 12);
            v_distx = vorrq_s32(v_distx, vshlq_n_s32(v_distx, 16));
            v_disty = vorrq_s32(v_disty, vshlq_n_s32(v_disty, 16));
            int16x8_t v_disty_ = vshlq_n_s16(vreinterpretq_s16_s32(v_disty), 4);

            interpolate_4_pixels_16_neon(
                        vreinterpretq_s16_u32(v_top.val[0]), vreinterpretq_s16_u32(v_top.val[1]),
                        vreinterpretq_s16_u32(v_bot.val[0]), vreinterpretq_s16_u32(v_bot.val[1]),
                        vreinterpretq_s16_s32(v_distx), vreinterpretq_s16_s32(v_disty),
                        v_disty_, colorMask, invColorMask, v_256, b);
            b += 4;
            v_fx = vaddq_s32(v_fx, v_fdx);
            v_fy = vaddq_s32(v_fy, v_fdy);
        }
#elif defined(__loongarch_sx)
        const __m128i v_fdx = __lsx_vreplgr2vr_w(fdx*4);
        const __m128i v_fdy = __lsx_vreplgr2vr_w(fdy*4);
        const __m128i v_fxy_r = __lsx_vreplgr2vr_w(0x8);
        __m128i v_fx = (__m128i)(v4i32){fx, fx + fdx, fx + fdx + fdx, fx + fdx + fdx + fdx};
        __m128i v_fy = (__m128i)(v4i32){fy, fy + fdy, fy + fdy + fdy, fy + fdy + fdy + fdy};

        const uchar *textureData = image.imageData;
        const qsizetype bytesPerLine = image.bytesPerLine;
        const __m128i zero = __lsx_vldi(0);
        const __m128i shuffleMask = (__m128i)(v8i16){0, 0, 0, 0, 4, 5, 6, 7};
        const __m128i shuffleMask1 = (__m128i)(v8i16){0, 0, 2, 2, 4, 4, 6, 6};
        const __m128i vbpl = __lsx_vshuf_h(shuffleMask, zero, __lsx_vinsgr2vr_w(zero, bytesPerLine/4, 0));

        while (b < boundedEnd - 3) {
            const __m128i vy = __lsx_vpickev_h(zero, __lsx_vsat_w(__lsx_vsrli_w(v_fy, 16), 15));
            // 4x16bit * 4x16bit -> 4x32bit
            __m128i offset = __lsx_vilvl_h(__lsx_vmuh_h(vy, vbpl), __lsx_vmul_h(vy, vbpl));
            offset = __lsx_vadd_w(offset, __lsx_vsrli_w(v_fx, 16));
            const int offset0 = __lsx_vpickve2gr_w(offset, 0);
            const int offset1 = __lsx_vpickve2gr_w(offset, 1);
            const int offset2 = __lsx_vpickve2gr_w(offset, 2);
            const int offset3 = __lsx_vpickve2gr_w(offset, 3);
            const uint *topData = (const uint *)(textureData);
            const __m128i tl = (__m128i)(v4u32){topData[offset0], topData[offset1], topData[offset2], topData[offset3]};
            const __m128i tr = (__m128i)(v4u32){topData[offset0 + 1], topData[offset1 + 1], topData[offset2 + 1], topData[offset3 + 1]};
            const uint *bottomData = (const uint *)(textureData + bytesPerLine);
            const __m128i bl = (__m128i)(v4u32){bottomData[offset0], bottomData[offset1], bottomData[offset2], bottomData[offset3]};
            const __m128i br = (__m128i)(v4u32){bottomData[offset0 + 1], bottomData[offset1 + 1], bottomData[offset2 + 1], bottomData[offset3 + 1]};

            __m128i v_distx = __lsx_vsrli_h(v_fx, 8);
            __m128i v_disty = __lsx_vsrli_h(v_fy, 8);
            v_distx = __lsx_vsrli_h(__lsx_vadd_w(v_distx, v_fxy_r), 4);
            v_disty = __lsx_vsrli_h(__lsx_vadd_w(v_disty, v_fxy_r), 4);
            v_distx = __lsx_vshuf_h(shuffleMask1, zero, v_distx);
            v_disty = __lsx_vshuf_h(shuffleMask1, zero, v_disty);

            interpolate_4_pixels_16_lsx(tl, tr, bl, br, v_distx, v_disty, b);
            b += 4;
            v_fx = __lsx_vadd_w(v_fx, v_fdx);
            v_fy = __lsx_vadd_w(v_fy, v_fdy);
        }
        fx = __lsx_vpickve2gr_w(v_fx, 0);
        fy = __lsx_vpickve2gr_w(v_fy, 0);
#endif
        while (b < boundedEnd) {
            int x = (fx >> 16);
            int y = (fy >> 16);

            const uint *s1 = (const uint *)image.scanLine(y);
            const uint *s2 = (const uint *)image.scanLine(y + 1);

            if (hasFastInterpolate4()) {
                int distx = (fx & 0x0000ffff) >> 8;
                int disty = (fy & 0x0000ffff) >> 8;
                *b = interpolate_4_pixels(s1 + x, s2 + x, distx, disty);
            } else {
                int distx = ((fx & 0x0000ffff) + 0x0800) >> 12;
                int disty = ((fy & 0x0000ffff) + 0x0800) >> 12;
                *b = interpolate_4_pixels_16(s1[x], s1[x + 1], s2[x], s2[x + 1], distx, disty);
            }

            fx += fdx;
            fy += fdy;
            ++b;
        }
    }

    while (b < end) {
        int x1 = (fx >> 16);
        int x2;
        int y1 = (fy >> 16);
        int y2;

        fetchTransformedBilinear_pixelBounds<blendType>(image.width, image.x1, image.x2 - 1, x1, x2);
        fetchTransformedBilinear_pixelBounds<blendType>(image.height, image.y1, image.y2 - 1, y1, y2);

        const uint *s1 = (const uint *)image.scanLine(y1);
        const uint *s2 = (const uint *)image.scanLine(y2);

        uint tl = s1[x1];
        uint tr = s1[x2];
        uint bl = s2[x1];
        uint br = s2[x2];

        if (hasFastInterpolate4()) {
            int distx = (fx & 0x0000ffff) >> 8;
            int disty = (fy & 0x0000ffff) >> 8;
            *b = interpolate_4_pixels(tl, tr, bl, br, distx, disty);
        } else {
            int distx = ((fx & 0x0000ffff) + 0x0800) >> 12;
            int disty = ((fy & 0x0000ffff) + 0x0800) >> 12;
            *b = interpolate_4_pixels_16(tl, tr, bl, br, distx, disty);
        }

        fx += fdx;
        fy += fdy;
        ++b;
    }
}